

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zesSchedulerSetComputeUnitDebugMode
          (zes_sched_handle_t hScheduler,ze_bool_t *pNeedReload)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar7 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesSchedulerSetComputeUnitDebugMode(hScheduler, pNeedReload)","");
  if (*(char *)(lVar7 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar7 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xa80);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar7 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar7 >> 3;
    if (lVar2 != lVar7) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x770))(plVar3,hScheduler,pNeedReload);
        if (result != ZE_RESULT_SUCCESS) goto LAB_00182b58;
        lVar6 = lVar6 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
    }
    lVar6 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesSchedulerSetComputeUnitDebugModePrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                             hScheduler,pNeedReload), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hScheduler,pNeedReload), result = zVar4, lVar2 != lVar7)) {
      lVar7 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar6 + 0xd30) + lVar7 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x778))(plVar3,hScheduler,pNeedReload,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar7 = lVar7 + 1;
        result = zVar4;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
    }
  }
LAB_00182b58:
  logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesSchedulerSetComputeUnitDebugMode(
        zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
        ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                        ///< apply the new scheduler mode.
        )
    {
        context.logger->log_trace("zesSchedulerSetComputeUnitDebugMode(hScheduler, pNeedReload)");

        auto pfnSetComputeUnitDebugMode = context.zesDdiTable.Scheduler.pfnSetComputeUnitDebugMode;

        if( nullptr == pfnSetComputeUnitDebugMode )
            return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesSchedulerSetComputeUnitDebugModePrologue( hScheduler, pNeedReload );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesSchedulerSetComputeUnitDebugModePrologue( hScheduler, pNeedReload );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }

        auto driver_result = pfnSetComputeUnitDebugMode( hScheduler, pNeedReload );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesSchedulerSetComputeUnitDebugModeEpilogue( hScheduler, pNeedReload ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", result);
        }

        return logAndPropagateResult("zesSchedulerSetComputeUnitDebugMode", driver_result);
    }